

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# utilities.h
# Opt level: O0

vector<char,_std::allocator<char>_> *
geometrycentral::applyPermutation<char,std::allocator<char>,std::allocator<unsigned_long>>
          (vector<char,_std::allocator<char>_> *sourceData,
          vector<unsigned_long,_std::allocator<unsigned_long>_> *permNewToOld)

{
  value_type vVar1;
  vector<char,_std::allocator<char>_> *this;
  size_type sVar2;
  const_reference pvVar3;
  const_reference pvVar4;
  reference pvVar5;
  vector<unsigned_long,_std::allocator<unsigned_long>_> *in_RDX;
  vector<char,_std::allocator<char>_> *in_RSI;
  vector<char,_std::allocator<char>_> *in_RDI;
  size_t i;
  vector<char,_std::allocator<char>_> *retVal;
  allocator_type *in_stack_ffffffffffffffa0;
  size_type sVar6;
  vector<char,_std::allocator<char>_> *this_00;
  size_type local_38;
  allocator<char> local_1a;
  undefined1 local_19;
  vector<unsigned_long,_std::allocator<unsigned_long>_> *local_18;
  vector<char,_std::allocator<char>_> *local_10;
  
  local_19 = 0;
  this_00 = in_RDI;
  local_18 = in_RDX;
  local_10 = in_RSI;
  std::vector<unsigned_long,_std::allocator<unsigned_long>_>::size(in_RDX);
  std::allocator<char>::allocator();
  std::vector<char,_std::allocator<char>_>::vector
            (this_00,(size_type)in_RDI,in_stack_ffffffffffffffa0);
  std::allocator<char>::~allocator(&local_1a);
  local_38 = 0;
  while (sVar6 = local_38,
        sVar2 = std::vector<unsigned_long,_std::allocator<unsigned_long>_>::size(local_18),
        sVar6 < sVar2) {
    pvVar3 = std::vector<unsigned_long,_std::allocator<unsigned_long>_>::operator[]
                       (local_18,local_38);
    this = local_10;
    if (*pvVar3 != 0xffffffffffffffff) {
      pvVar3 = std::vector<unsigned_long,_std::allocator<unsigned_long>_>::operator[]
                         (local_18,local_38);
      pvVar4 = std::vector<char,_std::allocator<char>_>::operator[](this,*pvVar3);
      vVar1 = *pvVar4;
      pvVar5 = std::vector<char,_std::allocator<char>_>::operator[](this_00,local_38);
      *pvVar5 = vVar1;
    }
    local_38 = local_38 + 1;
  }
  return in_RDI;
}

Assistant:

std::vector<T, A1> applyPermutation(const std::vector<T, A1>& sourceData, const std::vector<size_t, A2>& permNewToOld) {
  std::vector<T, A1> retVal(permNewToOld.size());
  for (size_t i = 0; i < permNewToOld.size(); i++) {
    if (permNewToOld[i] != INVALID_IND) {
      retVal[i] = sourceData[permNewToOld[i]];
    }
  }
  return retVal;
}